

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildWithLogTestNotInLogButOnDisk::Run(BuildWithLogTestNotInLogButOnDisk *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Builder *this_01;
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  Node *pNVar4;
  string err;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  iVar1 = g_current_test->assertion_failures_;
  state = &(this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules.state_;
  AssertParse(state,"rule cc\n  command = cc\nbuild out1: cc in\n",(ManifestParserOptions)0x0);
  if (iVar1 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"in",&local_72);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    this_00 = &(this->super_BuildWithLogTest).super_BuildTest.fs_;
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"out1",&local_72);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pTVar2 = g_current_test;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out1",&local_72);
    this_01 = &(this->super_BuildWithLogTest).super_BuildTest.builder_;
    pNVar4 = Builder::AddTarget(this_01,&local_70,&local_50);
    testing::Test::Check
              (pTVar2,pNVar4 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x509,"builder_.AddTarget(\"out1\", &err)");
    std::__cxx11::string::~string((string *)&local_70);
    pTVar2 = g_current_test;
    bVar3 = Builder::AlreadyUpToDate(this_01);
    testing::Test::Check
              (pTVar2,!bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x50a,"builder_.AlreadyUpToDate()");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_);
    State::Reset(state);
    pTVar2 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out1",&local_72);
    pNVar4 = Builder::AddTarget(this_01,&local_70,&local_50);
    testing::Test::Check
              (pTVar2,pNVar4 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x50f,"builder_.AddTarget(\"out1\", &err)");
    std::__cxx11::string::~string((string *)&local_70);
    pTVar2 = g_current_test;
    bVar3 = Builder::Build(this_01,&local_50);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x510,"builder_.Build(&err)");
    pTVar2 = g_current_test;
    bVar3 = Builder::AlreadyUpToDate(this_01);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x511,"builder_.AlreadyUpToDate()");
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(BuildWithLogTest, NotInLogButOnDisk) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n"
"  command = cc\n"
"build out1: cc in\n"));

  // Create input/output that would be considered up to date when
  // not considering the command line hash.
  fs_.Create("in", "");
  fs_.Create("out1", "");
  string err;

  // Because it's not in the log, it should not be up-to-date until
  // we build again.
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  EXPECT_FALSE(builder_.AlreadyUpToDate());

  command_runner_.commands_ran_.clear();
  state_.Reset();

  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_TRUE(builder_.AlreadyUpToDate());
}